

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int string_buffer_write8(StringBuffer *s,uint8_t *p,int len)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  
  iVar3 = s->len + len;
  if ((s->size < iVar3) && (iVar3 = string_buffer_realloc(s,iVar3,0), iVar3 != 0)) {
    return -1;
  }
  if (s->is_wide_char == 0) {
    memcpy((void *)((long)&s->str[1].header.ref_count + (long)s->len),p,(long)len);
  }
  else {
    uVar1 = 0;
    uVar2 = 0;
    if (0 < len) {
      uVar2 = (ulong)(uint)len;
    }
    for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
      *(ushort *)((long)&s->str[1].header.ref_count + ((long)s->len + uVar1) * 2) = (ushort)p[uVar1]
      ;
    }
  }
  s->len = s->len + len;
  return 0;
}

Assistant:

static int string_buffer_write8(StringBuffer *s, const uint8_t *p, int len)
{
    int i;

    if (s->len + len > s->size) {
        if (string_buffer_realloc(s, s->len + len, 0))
            return -1;
    }
    if (s->is_wide_char) {
        for (i = 0; i < len; i++) {
            s->str->u.str16[s->len + i] = p[i];
        }
        s->len += len;
    } else {
        memcpy(&s->str->u.str8[s->len], p, len);
        s->len += len;
    }
    return 0;
}